

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

size_t __thiscall CConnman::GetNodeCount(CConnman *this,ConnectionDirection flags)

{
  pointer ppCVar1;
  CNode **pnode;
  pointer ppCVar2;
  uint uVar3;
  size_t sVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock90;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_30);
  if (flags == Both) {
    sVar4 = (long)(this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
  }
  else {
    ppCVar2 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar1 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    sVar4 = 0;
    if (ppCVar2 != ppCVar1) {
      do {
        uVar3 = ((int)sVar4 + 1) -
                (uint)((Out - ((*ppCVar2)->m_conn_type == INBOUND) & flags) == None);
        sVar4 = (size_t)uVar3;
        ppCVar2 = ppCVar2 + 1;
      } while (ppCVar2 != ppCVar1);
      sVar4 = (size_t)uVar3;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return sVar4;
  }
  __stack_chk_fail();
}

Assistant:

size_t CConnman::GetNodeCount(ConnectionDirection flags) const
{
    LOCK(m_nodes_mutex);
    if (flags == ConnectionDirection::Both) // Shortcut if we want total
        return m_nodes.size();

    int nNum = 0;
    for (const auto& pnode : m_nodes) {
        if (flags & (pnode->IsInboundConn() ? ConnectionDirection::In : ConnectionDirection::Out)) {
            nNum++;
        }
    }

    return nNum;
}